

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cc
# Opt level: O0

void __thiscall
hgdb::rtl::ExpressionPrinter::handle(ExpressionPrinter *this,ElementSelectExpression *sym)

{
  bool bVar1;
  Expression *this_00;
  ostream *poVar2;
  unsigned_long *puVar3;
  NotSupportedException *this_01;
  optional<long> oVar4;
  allocator<char> local_71;
  string local_70;
  _Storage<long,_true> local_50;
  undefined1 local_48;
  ConstantValue *local_40;
  ConstantValue *v;
  optional<unsigned_long> select_value;
  Expression *selector;
  Expression *value;
  ElementSelectExpression *sym_local;
  ExpressionPrinter *this_local;
  
  this_00 = slang::ast::ElementSelectExpression::value(sym);
  select_value.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ =
       slang::ast::ElementSelectExpression::selector(sym);
  slang::ast::Expression::visit<hgdb::rtl::ExpressionPrinter&>(this_00,this);
  std::optional<unsigned_long>::optional((optional<unsigned_long> *)&v);
  if (*(long *)(select_value.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._8_8_ + 0x10) == 0) {
    std::operator<<((ostream *)&this->field_0x18,".");
    slang::ast::Expression::visit<hgdb::rtl::ExpressionPrinter&>
              ((Expression *)
               select_value.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._8_8_,this);
  }
  else {
    local_40 = *(ConstantValue **)
                (select_value.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_long>._8_8_ + 0x10);
    oVar4 = get_constant_value(local_40);
    local_50._M_value =
         oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_48 = oVar4.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_engaged;
    std::optional<unsigned_long>::operator=
              ((optional<unsigned_long> *)&v,(optional<long> *)&local_50);
    bVar1 = std::optional::operator_cast_to_bool((optional *)&v);
    if (!bVar1) {
      this_01 = (NotSupportedException *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"Only integer selection is supported",&local_71);
      NotSupportedException::NotSupportedException(this_01,&local_70,*this->loc_);
      __cxa_throw(this_01,&NotSupportedException::typeinfo,
                  NotSupportedException::~NotSupportedException);
    }
    poVar2 = std::operator<<((ostream *)&this->field_0x18,'[');
    puVar3 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&v);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*puVar3);
    std::operator<<(poVar2,']');
  }
  return;
}

Assistant:

void handle(const slang::ast::ElementSelectExpression &sym) {
        auto const &value = sym.value();
        auto const &selector = sym.selector();

        value.visit(*this);

        // depends on whether the selector is a constant or not
        std::optional<uint64_t> select_value;
        if (selector.constant) {
            auto const &v = *selector.constant;
            select_value = get_constant_value(v);
            if (select_value) {
                ss_ << '[' << *select_value << ']';
            } else {
                throw NotSupportedException("Only integer selection is supported", loc_);
            }
        } else {
            ss_ << ".";
            selector.visit(*this);
        }
    }